

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

double Catch::Benchmark::Detail::anon_unknown_7::standard_deviation(double *first,double *last)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = mean(first,last);
  dVar3 = 0.0;
  for (pdVar1 = first; pdVar1 != last; pdVar1 = pdVar1 + 1) {
    dVar3 = dVar3 + (*pdVar1 - dVar2) * (*pdVar1 - dVar2);
  }
  dVar3 = dVar3 / (double)((long)last - (long)first >> 3);
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar2 = sqrt(dVar3);
  return dVar2;
}

Assistant:

static double
                standard_deviation( double const* first, double const* last ) {
                    auto m = Catch::Benchmark::Detail::mean( first, last );
                    double variance =
                        std::accumulate( first,
                                         last,
                                         0.,
                                         [m]( double a, double b ) {
                                             double diff = b - m;
                                             return a + diff * diff;
                                         } ) /
                        ( last - first );
                    return std::sqrt( variance );
                }